

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.h
# Opt level: O1

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>::Write
          (TPZGeoBlend<pzgeom::TPZGeoTriangle> *this,TPZStream *buf,int withclassid)

{
  long lVar1;
  
  TPZGeoTriangle::Write(&this->super_TPZGeoTriangle,buf,withclassid);
  lVar1 = 0;
  do {
    (**(code **)(*(long *)((long)&this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable + lVar1) +
                0x28))((long)&this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable + lVar1,buf,
                       withclassid);
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x78);
  lVar1 = 0xa0;
  do {
    (**(code **)(*(long *)((long)(this->super_TPZGeoTriangle).
                                 super_TPZNodeRep<3,_pztopology::TPZTriangle>.fNodeIndexes +
                          lVar1 + -8) + 0x28))
              ((long)(this->super_TPZGeoTriangle).super_TPZNodeRep<3,_pztopology::TPZTriangle>.
                     fNodeIndexes + lVar1 + -8,buf,withclassid);
    lVar1 = lVar1 + 0x1a0;
  } while (lVar1 != 0x8c0);
  return;
}

Assistant:

void Write(TPZStream &buf, int withclassid) const override{
            TGeo::Write(buf, withclassid);
            for (int is = 0; is < 1 + TGeo::NSides - TGeo::NNodes; is++) {
                fNeighbours[is].Write(buf, withclassid);
            }
            for (int is = 0; is < 1 + TGeo::NSides - TGeo::NNodes; is++) {
                fTrans[is].Write(buf, withclassid);
            }
        }